

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapequad.cpp
# Opt level: O1

void pzshape::TPZShapeQuad::Shape2dQuadInternal
               (TPZVec<Fad<double>_> *x,int order,TPZVec<Fad<double>_> *phi,
               int quad_transformation_index)

{
  double dVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  TPZVec<Fad<double>_> phi1;
  TPZVec<Fad<double>_> phi0;
  TPZVec<Fad<double>_> out;
  TPZVec<Fad<double>_> local_d0;
  TPZVec<Fad<double>_> local_b0;
  long local_90;
  ulong local_88;
  ulong local_80;
  undefined1 local_78 [32];
  TPZVec<Fad<double>_> local_58;
  double local_38;
  
  if (-1 < order) {
    TPZVec<Fad<double>_>::TPZVec(&local_58,2);
    TransformPoint2dQ(quad_transformation_index,x,&local_58);
    uVar3 = order + 1;
    uVar4 = (ulong)uVar3;
    if ((phi->fNElements < (long)(ulong)(uVar3 * uVar3)) || ((phi->fStore->dx_).num_elts < 3)) {
      local_d0._vptr_TPZVec = (_func_int **)0x0;
      Fad<double>::Fad((Fad<double> *)&local_b0,3,(double *)&local_d0);
      (*phi->_vptr_TPZVec[2])(phi,(ulong)(uVar3 * uVar3),&local_b0);
      Fad<double>::~Fad((Fad<double> *)&local_b0);
    }
    local_78._0_8_ = (Fad<double> *)0x0;
    Fad<double>::Fad((Fad<double> *)&local_d0,3,(double *)local_78);
    TPZVec<Fad<double>_>::TPZVec(&local_b0,0x14,(Fad<double> *)&local_d0);
    Fad<double>::~Fad((Fad<double> *)&local_d0);
    local_38 = 0.0;
    Fad<double>::Fad((Fad<double> *)local_78,3,&local_38);
    TPZVec<Fad<double>_>::TPZVec(&local_d0,0x14,(Fad<double> *)local_78);
    Fad<double>::~Fad((Fad<double> *)local_78);
    (*(code *)TPZShapeLinear::FADfOrthogonal)(local_58.fStore,uVar3,&local_b0);
    (*(code *)TPZShapeLinear::FADfOrthogonal)(local_58.fStore + 1,uVar4,&local_d0);
    local_90 = uVar4 << 5;
    lVar5 = 0;
    uVar2 = 0;
    local_88 = uVar4;
    do {
      lVar6 = 0;
      uVar4 = local_88;
      local_80 = uVar2;
      do {
        local_78._0_8_ = local_b0.fStore + uVar2;
        local_78._8_8_ = (long)&(local_d0.fStore)->val_ + lVar6;
        Fad<double>::operator=
                  ((Fad<double> *)((long)&phi->fStore->val_ + lVar6 + lVar5),
                   (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_78);
        lVar6 = lVar6 + 0x20;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      uVar2 = local_80 + 1;
      lVar5 = lVar5 + local_90;
    } while (uVar2 != local_88);
    local_d0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01846938;
    if (local_d0.fStore != (Fad<double> *)0x0) {
      dVar1 = local_d0.fStore[-1].defaultVal;
      if (dVar1 != 0.0) {
        lVar5 = (long)dVar1 << 5;
        do {
          Fad<double>::~Fad((Fad<double> *)((long)&local_d0.fStore[-1].val_ + lVar5));
          lVar5 = lVar5 + -0x20;
        } while (lVar5 != 0);
      }
      operator_delete__(&local_d0.fStore[-1].defaultVal,(long)dVar1 << 5 | 8);
    }
    local_b0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01846938;
    if (local_b0.fStore != (Fad<double> *)0x0) {
      dVar1 = local_b0.fStore[-1].defaultVal;
      if (dVar1 != 0.0) {
        lVar5 = (long)dVar1 << 5;
        do {
          Fad<double>::~Fad((Fad<double> *)((long)&local_b0.fStore[-1].val_ + lVar5));
          lVar5 = lVar5 + -0x20;
        } while (lVar5 != 0);
      }
      operator_delete__(&local_b0.fStore[-1].defaultVal,(long)dVar1 << 5 | 8);
    }
    local_58._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01846938;
    if (local_58.fStore != (Fad<double> *)0x0) {
      dVar1 = local_58.fStore[-1].defaultVal;
      if (dVar1 != 0.0) {
        lVar5 = (long)dVar1 << 5;
        do {
          Fad<double>::~Fad((Fad<double> *)((long)&local_58.fStore[-1].val_ + lVar5));
          lVar5 = lVar5 + -0x20;
        } while (lVar5 != 0);
      }
      operator_delete__(&local_58.fStore[-1].defaultVal,(long)dVar1 << 5 | 8);
    }
  }
  return;
}

Assistant:

void TPZShapeQuad::Shape2dQuadInternal(TPZVec<FADREAL> &x, int order,
										   TPZVec<FADREAL> &phi,int quad_transformation_index) {
		
		const int ndim = 3;
		if(order < 0) return;
		int ord1 = order+1;
		int numshape = ord1*ord1;
		TPZVec<FADREAL> out(2);
		TransformPoint2dQ(quad_transformation_index,x,out);
		
		if(numshape > phi.NElements()/*Rows()*/ || phi[0].size()/*Cols()*/ < ndim) phi.Resize(numshape, FADREAL(ndim, 0.0));
		//if(dphi.Rows() < 2 || dphi.Cols() < numshape) dphi.Resize(2,numshape);
		//REAL store1[20],store2[20],store3[20],store4[20];
		//TPZFMatrix<REAL> phi0(ord1,1,store1,20),phi1(ord1,1,store2,20),dphi0(1,ord1,store3,20),dphi1(1,ord1,store4,20);
		TPZVec<FADREAL> phi0(20, FADREAL(ndim, 0.0)),
		phi1(20, FADREAL(ndim, 0.0));
		
		TPZShapeLinear::FADfOrthogonal(out[0],ord1,phi0);
		TPZShapeLinear::FADfOrthogonal(out[1],ord1,phi1);
		for (int i=0;i<ord1;i++) {
			for (int j=0;j<ord1;j++) {
				int index = i*ord1+j;
				//phi(index,0) =  phi0(i,0)* phi1(j,0);
				phi[index] =  phi0[i] * phi1[j];
				/*dphi(0,index) = dphi0(0,i)* phi1(j,0);
				 dphi(1,index) =  phi0(i,0)*dphi1(0,j);*/
			}
		}
		//  TransformDerivative2dQ(quad_transformation_index,numshape,phi);
	}